

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testrecurse.c
# Opt level: O3

int notRecursiveDetectTest(char *filename,char *result,char *err,int options)

{
  long *plVar1;
  long lVar2;
  
  nb_tests = nb_tests + 1;
  plVar1 = (long *)xmlNewParserCtxt();
  if ((options & 1U) != 0) {
    lVar2 = *plVar1;
    *(undefined8 *)(lVar2 + 200) = 0;
    *(undefined8 *)(lVar2 + 0x70) = 0;
    *(undefined8 *)(lVar2 + 0x78) = 0;
    *(undefined8 *)(lVar2 + 0x88) = 0;
    *(undefined8 *)(lVar2 + 0x90) = 0;
    *(undefined8 *)(lVar2 + 0x98) = 0;
    *(undefined8 *)(lVar2 + 0xa0) = 0;
    *(undefined8 *)(lVar2 + 0xe8) = 0;
    *(undefined8 *)(lVar2 + 0xf0) = 0;
  }
  lVar2 = xmlCtxtReadFile(plVar1,filename,0,options & 2U ^ 6);
  if (lVar2 == 0) {
    fprintf(_stderr,"Failed to parse correct file %s\n",filename);
  }
  else {
    xmlFreeDoc(lVar2);
  }
  xmlFreeParserCtxt(plVar1);
  return (uint)(lVar2 == 0);
}

Assistant:

static int
notRecursiveDetectTest(const char *filename,
             const char *result ATTRIBUTE_UNUSED,
             const char *err ATTRIBUTE_UNUSED,
	     int options) {
    xmlDocPtr doc;
    xmlParserCtxtPtr ctxt;
    int res = 0;
    int parserOptions = XML_PARSE_DTDLOAD;

    nb_tests++;

    ctxt = xmlNewParserCtxt();
    if (options & OPT_SAX)
        initSAX(ctxt);
    if ((options & OPT_NO_SUBST) == 0)
        parserOptions |= XML_PARSE_NOENT;
    /*
     * base of the test, parse with the old API
     */
    doc = xmlCtxtReadFile(ctxt, filename, NULL, parserOptions);
    if (doc == NULL) {
        fprintf(stderr, "Failed to parse correct file %s\n", filename);
	xmlFreeParserCtxt(ctxt);
        return(1);
    }
    xmlFreeDoc(doc);
    xmlFreeParserCtxt(ctxt);

    return(res);
}